

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int64_t mipsdsp_mul_q31_q31(int32_t ac,uint32_t a,uint32_t b,CPUMIPSState_conflict5 *env)

{
  undefined8 local_28;
  uint64_t temp;
  CPUMIPSState_conflict5 *env_local;
  uint32_t b_local;
  uint32_t a_local;
  int32_t ac_local;
  
  if ((a == 0x80000000) && (b == 0x80000000)) {
    local_28 = 0x7fffffffffffffff;
    set_DSPControl_overflow_flag(1,ac + 0x10,env);
  }
  else {
    local_28 = (long)(int)a * (long)(int)b * 2;
  }
  return local_28;
}

Assistant:

static inline int64_t mipsdsp_mul_q31_q31(int32_t ac, uint32_t a, uint32_t b,
                                          CPUMIPSState *env)
{
    uint64_t temp;

    if ((a == 0x80000000) && (b == 0x80000000)) {
        temp = (0x01ull << 63) - 1;
        set_DSPControl_overflow_flag(1, 16 + ac, env);
    } else {
        temp = ((int64_t)(int32_t)a * (int32_t)b) << 1;
    }

    return temp;
}